

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O1

int evfilt_write_knote_delete(filter *filt,knote *kn)

{
  int iVar1;
  
  if (((kn->kn_flags & 1) == 0) || ((kn->field_10).kn_timerfd == -1)) {
    iVar1 = epoll_update(2,filt,kn,4,true);
    return iVar1;
  }
  if ((kn->kn_registered != 0) &&
     (iVar1 = epoll_ctl(kn->kn_epollfd,2,(kn->field_10).kn_timerfd,(epoll_event *)0x0), iVar1 < 0))
  {
    return -1;
  }
  kn->kn_registered = 0;
  close((kn->field_10).kn_timerfd);
  (kn->field_10).kn_timerfd = -1;
  return 0;
}

Assistant:

int
evfilt_write_knote_delete(struct filter *filt, struct knote *kn)
{
    if ((kn->kn_flags & KNFL_FILE) && (kn->kn_eventfd != -1)) {
        if (kn->kn_registered && epoll_ctl(kn->kn_epollfd, EPOLL_CTL_DEL, kn->kn_eventfd, NULL) < 0) {
            dbg_perror("epoll_ctl(2)");
            return (-1);
        }
        kn->kn_registered = 0;
        (void) close(kn->kn_eventfd);
        kn->kn_eventfd = -1;
        return (0);
    }

    return epoll_update(EPOLL_CTL_DEL, filt, kn, EPOLLOUT, true);
}